

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O3

void __thiscall
upb::generator::Output::operator()
          (Output *this,string_view format,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg_1,char **arg_2,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg_3,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg_4,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg_5,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg_6)

{
  pointer pcVar1;
  size_type sVar2;
  pointer pcVar3;
  size_type sVar4;
  char *__s;
  string_view format_00;
  string_view data;
  char *local_e0;
  size_t local_d8;
  char local_d0;
  undefined7 uStack_cf;
  Output *local_c0;
  Nonnull<std::string_*> local_b8;
  char *local_b0;
  size_type local_a8;
  pointer local_a0;
  size_type local_98;
  pointer local_90;
  size_t local_88;
  char *local_80;
  size_type local_78;
  pointer local_70;
  size_type local_68;
  pointer local_60;
  size_type local_58;
  pointer local_50;
  size_type local_48;
  pointer local_40;
  
  local_b0 = format._M_str;
  local_b8 = (Nonnull<std::string_*>)format._M_len;
  pcVar1 = (arg->_M_dataplus)._M_p;
  sVar2 = arg->_M_string_length;
  pcVar3 = (arg_1->_M_dataplus)._M_p;
  sVar4 = arg_1->_M_string_length;
  __s = *arg_2;
  local_c0 = this;
  if (__s == (char *)0x0) {
    local_88 = 0;
  }
  else {
    local_88 = strlen(__s);
  }
  local_70 = (arg_3->_M_dataplus)._M_p;
  local_78 = arg_3->_M_string_length;
  local_60 = (arg_4->_M_dataplus)._M_p;
  local_68 = arg_4->_M_string_length;
  local_50 = (arg_5->_M_dataplus)._M_p;
  local_58 = arg_5->_M_string_length;
  local_40 = (arg_6->_M_dataplus)._M_p;
  local_48 = arg_6->_M_string_length;
  local_d8 = 0;
  local_d0 = '\0';
  format_00._M_str = (char *)&local_a8;
  format_00._M_len = (size_t)local_b0;
  local_e0 = &local_d0;
  local_a8 = sVar2;
  local_a0 = pcVar1;
  local_98 = sVar4;
  local_90 = pcVar3;
  local_80 = __s;
  absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
            ((substitute_internal *)&local_e0,local_b8,format_00,
             (Nullable<const_absl::string_view_*>)0x7,(size_t)local_50);
  data._M_str = local_e0;
  data._M_len = local_d8;
  Write(local_c0,data);
  if (local_e0 != &local_d0) {
    operator_delete(local_e0,CONCAT71(uStack_cf,local_d0) + 1);
  }
  return;
}

Assistant:

void operator()(absl::string_view format, const Arg&... arg) {
    Write(absl::Substitute(format, arg...));
  }